

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall DRotatePoly::Tick(DRotatePoly *this)

{
  double dVar1;
  bool bVar2;
  long lVar3;
  FPolyObj *this_00;
  ulong uVar4;
  double dVar5;
  DAngle local_18;
  
  lVar3 = (long)po_NumPolyobjs;
  if (0 < lVar3) {
    this_00 = polyobjs;
    do {
      if (this_00->tag == (this->super_DPolyAction).m_PolyObj) goto LAB_00470463;
      this_00 = this_00 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  this_00 = (FPolyObj *)0x0;
LAB_00470463:
  if (this_00 != (FPolyObj *)0x0) {
    dVar5 = (this->super_DPolyAction).m_Dist;
    if (((dVar5 != -1.0) || (NAN(dVar5))) &&
       (dVar1 = (this->super_DPolyAction).m_Speed, dVar5 < ABS(dVar1))) {
      uVar4 = -(ulong)(dVar1 < 0.0);
      (this->super_DPolyAction).m_Speed = (double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4);
    }
    local_18.Degrees = (this->super_DPolyAction).m_Speed;
    bVar2 = FPolyObj::RotatePolyobj(this_00,&local_18,false);
    if (bVar2) {
      dVar5 = (this->super_DPolyAction).m_Dist;
      if ((dVar5 != -1.0) || (NAN(dVar5))) {
        dVar5 = dVar5 - ABS((this->super_DPolyAction).m_Speed);
        (this->super_DPolyAction).m_Dist = dVar5;
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          SN_StopSequence(this_00);
          (*(this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject[4])(this);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void DRotatePoly::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);
	if (poly == NULL) return;

	// Don't let non-perpetual polyobjs overshoot their targets.
	if (m_Dist != -1 && m_Dist < fabs(m_Speed))
	{
		m_Speed = m_Speed < 0 ? -m_Dist : m_Dist;
	}

	if (poly->RotatePolyobj (m_Speed))
	{
		if (m_Dist == -1)
		{ // perpetual polyobj
			return;
		}
		m_Dist -= fabs(m_Speed);
		if (m_Dist == 0)
		{
			SN_StopSequence (poly);
			Destroy ();
		}
	}
}